

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  rep rVar4;
  iterator __first;
  iterator __last;
  uint *puVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_ef0;
  rep local_ee8;
  long time_elapsed_ns_2;
  type time_diff_2;
  time_point time_point_after_2;
  iterator iStack_ec8;
  int element;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  time_point time_point_before_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  istream local_e08 [8];
  ifstream input_file_3;
  SplayTree local_c00;
  SplayTree sTree_2;
  int i_2;
  int local_bdc;
  undefined1 local_bd8 [8];
  vector<int,_std::allocator<int>_> csv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  long local_b20;
  ifstream input_file_2;
  allocator<char> local_911;
  undefined1 local_910 [8];
  string line_2;
  long time_elapsed_ns_1;
  type time_diff_1;
  time_point time_point_after_1;
  time_point time_point_before_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  ifstream local_828 [527];
  allocator<char> local_619;
  undefined1 local_618 [8];
  string line_1;
  long local_5d8;
  ifstream input_file_1;
  SplayTree local_3d0;
  SplayTree sTree_1;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> _Stack_3c0;
  int i_1;
  rep local_3b8;
  long time_elapsed_ns;
  type time_diff;
  time_point time_point_after;
  time_point time_point_before;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  long local_2f8;
  ifstream input_file;
  allocator<char> local_e9;
  undefined1 local_e8 [8];
  string line;
  SplayTree sTree;
  int i;
  string dataset;
  undefined1 local_90 [8];
  string count_of_elements;
  int trials;
  string operation;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string path;
  
  path.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_30,&kDatasetPath,&local_31);
  std::allocator<char>::~allocator(&local_31);
  poVar3 = std::operator<<((ostream *)&std::cout,"Path to the \'dataset/\' folder: ");
  poVar3 = std::operator<<(poVar3,(string *)local_30);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&trials,"remove",
             (allocator<char> *)(count_of_elements.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(count_of_elements.field_2._M_local_buf + 0xf));
  count_of_elements.field_2._8_4_ = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"5000000",(allocator<char> *)(dataset.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(dataset.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"01",(allocator<char> *)((long)&sTree.root + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sTree.root + 7));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &trials,"insert");
  if (bVar1) {
    for (sTree.root._0_4_ = 0; (int)sTree.root < (int)count_of_elements.field_2._8_4_;
        sTree.root._0_4_ = (int)sTree.root + 1) {
      itis::SplayTree::SplayTree((SplayTree *)((long)&line.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,"1",&local_e9);
      std::allocator<char>::~allocator(&local_e9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/insert/");
      std::operator+(&local_378,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      std::operator+(&local_358,&local_378,"/");
      std::operator+(&local_338,&local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_318,&local_338,".csv");
      std::ifstream::ifstream(&local_2f8,&local_318,8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&time_point_before);
      time_point_after.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_2f8 + *(long *)(local_2f8 + -0x18)));
      if (bVar1) {
        while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_e8,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_2f8,(string *)local_e8);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi((string *)local_e8,(size_t *)0x0,10);
          itis::SplayTree::insert((SplayTree *)((long)&line.field_2 + 8),iVar2);
        }
      }
      time_diff.__r = std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      time_elapsed_ns =
           (long)std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&time_diff,&time_point_after);
      _Stack_3c0 = std::chrono::
                   duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                             ((duration<long,_std::ratio<1L,_1000000000L>_> *)&time_elapsed_ns);
      local_3b8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                            (&stack0xfffffffffffffc40);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_3b8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ifstream::~ifstream(&local_2f8);
      std::__cxx11::string::~string((string *)local_e8);
      itis::SplayTree::~SplayTree((SplayTree *)((long)&line.field_2 + 8));
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &trials,"search");
  if (bVar1) {
    for (sTree_1.root._4_4_ = 0; sTree_1.root._4_4_ < (int)count_of_elements.field_2._8_4_;
        sTree_1.root._4_4_ = sTree_1.root._4_4_ + 1) {
      itis::SplayTree::SplayTree(&local_3d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&line_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/5000000.csv");
      std::ifstream::ifstream(&local_5d8,(undefined1 *)((long)&line_1.field_2 + 8),8);
      std::__cxx11::string::~string((string *)(line_1.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_618,"1",&local_619);
      std::allocator<char>::~allocator(&local_619);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_5d8 + *(long *)(local_5d8 + -0x18)));
      if (bVar1) {
        while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_618,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_5d8,(string *)local_618);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_618,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi((string *)local_618,(size_t *)0x0,10);
          itis::SplayTree::insert(&local_3d0,iVar2);
        }
      }
      std::ifstream::close();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/find/");
      std::operator+(&local_8a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      std::operator+(&local_888,&local_8a8,"/");
      std::operator+(&local_868,&local_888,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_848,&local_868,".csv");
      std::ifstream::ifstream(local_828,&local_848,8);
      std::ifstream::operator=(&local_5d8,local_828);
      std::ifstream::~ifstream(local_828);
      std::__cxx11::string::~string((string *)&local_848);
      std::__cxx11::string::~string((string *)&local_868);
      std::__cxx11::string::~string((string *)&local_888);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::__cxx11::string::~string((string *)&time_point_before_1);
      std::__cxx11::string::operator=((string *)local_618,"1");
      time_point_after_1.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_5d8 + *(long *)(local_5d8 + -0x18)));
      if (bVar1) {
        while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_618,""), bVar1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_5d8,(string *)local_618);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_618,"");
          if (bVar1) break;
          iVar2 = std::__cxx11::stoi((string *)local_618,(size_t *)0x0,10);
          itis::SplayTree::search(&local_3d0,iVar2);
        }
      }
      time_diff_1.__r = std::chrono::_V2::steady_clock::now();
      std::ifstream::close();
      time_elapsed_ns_1 =
           (long)std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&time_diff_1,&time_point_after_1);
      line_2.field_2._8_8_ =
           std::chrono::
           duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)&time_elapsed_ns_1);
      rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)((long)&line_2.field_2 + 8)
                        );
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,rVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_618);
      std::ifstream::~ifstream(&local_5d8);
      itis::SplayTree::~SplayTree(&local_3d0);
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &trials,"remove");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_910,"1",&local_911);
    std::allocator<char>::~allocator(&local_911);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &csv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   "/remove/");
    std::operator+(&local_ba0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &csv.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
    std::operator+(&local_b80,&local_ba0,"/");
    std::operator+(&local_b60,&local_b80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::operator+(&local_b40,&local_b60,".csv");
    std::ifstream::ifstream(&local_b20,&local_b40,8);
    std::__cxx11::string::~string((string *)&local_b40);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b80);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string
              ((string *)
               &csv.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_bd8);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_b20 + *(long *)(local_b20 + -0x18)));
    if (bVar1) {
      while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_910,""), bVar1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_b20,(string *)local_910);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_910,"");
        if (bVar1) break;
        local_bdc = std::__cxx11::stoi((string *)local_910,(size_t *)0x0,10);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_bd8,&local_bdc);
      }
    }
    std::ifstream::close();
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_bd8);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_bd8);
    std::random_shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    for (sTree_2.root._4_4_ = 0; sTree_2.root._4_4_ < (int)count_of_elements.field_2._8_4_;
        sTree_2.root._4_4_ = sTree_2.root._4_4_ + 1) {
      itis::SplayTree::SplayTree(&local_c00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                     "/remove/");
      std::operator+(&local_e88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &time_point_before_2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      std::operator+(&local_e68,&local_e88,"/");
      std::operator+(&local_e48,&local_e68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::operator+(&local_e28,&local_e48,".csv");
      std::ifstream::ifstream(local_e08,&local_e28,8);
      std::__cxx11::string::~string((string *)&local_e28);
      std::__cxx11::string::~string((string *)&local_e48);
      std::__cxx11::string::~string((string *)&local_e68);
      std::__cxx11::string::~string((string *)&local_e88);
      std::__cxx11::string::~string((string *)&time_point_before_2);
      std::__cxx11::string::operator=((string *)local_910,"1");
      while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_910,""), bVar1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (local_e08,(string *)local_910);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_910,"");
        if (bVar1) break;
        iVar2 = std::__cxx11::stoi((string *)local_910,(size_t *)0x0,10);
        itis::SplayTree::insert(&local_c00,iVar2);
      }
      std::ifstream::close();
      __range3 = (vector<int,_std::allocator<int>_> *)std::chrono::_V2::steady_clock::now();
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)local_bd8);
      iStack_ec8 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_bd8);
      while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffff138), bVar1) {
        puVar5 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&__end3);
        itis::SplayTree::remove(&local_c00,(char *)(ulong)*puVar5);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      time_diff_2.__r = std::chrono::_V2::steady_clock::now();
      time_elapsed_ns_2 =
           (long)std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&time_diff_2,
                            (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&__range3);
      local_ef0.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)&time_elapsed_ns_2);
      local_ee8 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_ef0);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_ee8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ifstream::~ifstream(local_e08);
      itis::SplayTree::~SplayTree(&local_c00);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_bd8);
    std::ifstream::~ifstream(&local_b20);
    std::__cxx11::string::~string((string *)local_910);
  }
  path.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)&trials);
  std::__cxx11::string::~string((string *)local_30);
  return path.field_2._12_4_;
}

Assistant:

int main() {
  const auto path = string(kDatasetPath);
  cout << "Path to the 'dataset/' folder: " << path << endl;
  // меняете значение переменной operation на ту операцию, которую надо вам проанализировать
  string operation = "remove";
  // в переменной trials - кол-во прогонов
  int trials = 10;
  // ну тут по имени переменной думаю всё понятно
  string count_of_elements = "5000000";
  // номер набора данных, тоже меняете)
  string dataset = "01";
  if (operation == "insert") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      string line = "1"; // нужна, чтобы прошел первый прогон, так как сначала строка пустая (в следующих операциях точно также)
      // открываем csv файл (в следующих операциях точно также)
      auto input_file = ifstream(path + "/insert/" + dataset + "/" + count_of_elements + ".csv");
      const auto time_point_before = chrono::steady_clock::now();
      // здесь находится участок кода, время которого необходимо замерить
      // заполнение дерева
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line)); //используем stoi(string to integer), так как первоначально line имеет тип string
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "search") {
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;
      auto input_file = ifstream(path + "/5000000.csv");
      string line = "1";
      // заполнение дерева определенным датасетом с количеством элементов >= количества элемента при поиске
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.insert(stoi(line));
        }
      }
      input_file.close();
      input_file = ifstream(path + "/find/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      const auto time_point_before = chrono::steady_clock::now();
      // замер операции поиск
      if (input_file) {
        while (line != "") {
          getline(input_file, line);
          if (line == "") {
            break;
          }
          sTree.search(stoi(line));
        }
      }
      const auto time_point_after = chrono::steady_clock::now();
      input_file.close();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  if (operation == "remove") {
    string line = "1";
    auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
    // создание вектора
    vector<int> csv;
    //заполнение вектора
    if (input_file) {
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        csv.push_back(stoi(line));
      }
    }
    input_file.close();
    //перемешивание вектора
    random_shuffle(csv.begin(), csv.end());
    //прогонка
    for (int i = 0; i < trials; i++) {
      SplayTree sTree;  //создание дерева
      auto input_file = ifstream(path + "/remove/" + dataset + "/" + count_of_elements + ".csv");
      line = "1";
      //заполнение дерева
      while (line != "") {
        getline(input_file, line);
        if (line == "") {
          break;
        }
        sTree.insert(stoi(line));
      }
      input_file.close();
      //замер времени для операции remove
      const auto time_point_before = chrono::steady_clock::now();
      for (int element : csv) {
        sTree.remove(element);
      }
      const auto time_point_after = chrono::steady_clock::now();
      const auto time_diff = time_point_after - time_point_before;
      const long time_elapsed_ns = chrono::duration_cast<chrono::nanoseconds>(time_diff).count();
      cout << time_elapsed_ns << endl;
    }
  }
  return 0;
}